

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

FUNCTION_RETURN
parse_blkid(string *blkid_file_content,vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_out,
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *disk_by_uuid)

{
  undefined8 this;
  long lVar1;
  char *pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_698;
  allocator local_669;
  string local_668;
  undefined1 local_648 [8];
  string disk_type;
  string local_620;
  undefined1 local_600 [8];
  string disk_sn;
  string local_5d8;
  undefined1 local_5b8 [8];
  string label;
  string local_588 [8];
  string device;
  string cur_dev;
  size_t pos;
  size_t oldpos;
  undefined1 local_530 [4];
  int diskNum;
  DiskInfo diskInfo;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *disk_by_uuid_local;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_out_local;
  string *blkid_file_content_local;
  
  diskInfo._1288_8_ = disk_by_uuid;
  memset(local_530,0,0x510);
  oldpos._4_4_ = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char *)blkid_file_content,0x3e464d);
    if (lVar1 == -1) break;
    pcVar2 = device.field_2._M_local_buf + 8;
    std::__cxx11::string::substr((ulong)pcVar2,(ulong)blkid_file_content);
    local_530 = (undefined1  [4])oldpos._4_4_;
    std::__cxx11::string::find_last_of(pcVar2,0x403908);
    std::__cxx11::string::substr((ulong)local_588,(ulong)pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    license::mstrlcpy((char *)&diskNum,pcVar2,0x400);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_5d8,"PARTLABEL",(allocator *)(disk_sn.field_2._M_local_buf + 0xf));
    getAttribute((string *)local_5b8,(string *)((long)&device.field_2 + 8),&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)(disk_sn.field_2._M_local_buf + 0xf));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    license::mstrlcpy((char *)(diskInfo.disk_sn + 1),pcVar2,0xff);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_620,"UUID",(allocator *)(disk_type.field_2._M_local_buf + 0xf));
    getAttribute((string *)local_600,(string *)((long)&device.field_2 + 8),&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator((allocator<char> *)(disk_type.field_2._M_local_buf + 0xf));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    parseUUID(pcVar2,(uchar *)(diskInfo.device + 0x3f8),8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_668,"TYPE",&local_669);
    getAttribute((string *)local_648,(string *)((long)&device.field_2 + 8),&local_668);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator((allocator<char> *)&local_669);
    this = diskInfo._1288_8_;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
              (&local_698,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600,
               (int *)local_530);
    std::
    unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::insert<std::pair<std::__cxx11::string,int>>
              ((unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)this,&local_698);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_698);
    diskInfo.label[0xf7] = '\x01';
    diskInfo.disk_sn[0] = '\x01';
    diskInfo.label[0xf8] =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_648,"swap");
    std::vector<DiskInfo,_std::allocator<DiskInfo>_>::push_back
              (diskInfos_out,(value_type *)local_530);
    std::__cxx11::string::~string((string *)local_648);
    std::__cxx11::string::~string((string *)local_600);
    std::__cxx11::string::~string((string *)local_5b8);
    std::__cxx11::string::~string(local_588);
    std::__cxx11::string::~string((string *)(device.field_2._M_local_buf + 8));
    oldpos._4_4_ = oldpos._4_4_ + 1;
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN parse_blkid(const std::string &blkid_file_content, std::vector<DiskInfo> &diskInfos_out,
							std::unordered_map<std::string, int> &disk_by_uuid) {
	DiskInfo diskInfo = {};
	int diskNum = 0;
	for (std::size_t oldpos = 0, pos = 0; (pos = blkid_file_content.find("</device>", oldpos)) != std::string::npos;
		 oldpos = pos + 1) {
		std::string cur_dev = blkid_file_content.substr(oldpos, pos);
		diskInfo.id = diskNum++;
		std::string device = cur_dev.substr(cur_dev.find_last_of(">") + 1);
		mstrlcpy(diskInfo.device, device.c_str(), MAX_PATH);
		std::string label = getAttribute(cur_dev, "PARTLABEL");
		mstrlcpy(diskInfo.label, label.c_str(), 255);
		std::string disk_sn = getAttribute(cur_dev, "UUID");
		parseUUID(disk_sn.c_str(), diskInfo.disk_sn, sizeof(diskInfo.disk_sn));
		std::string disk_type = getAttribute(cur_dev, "TYPE");
		disk_by_uuid.insert(std::pair<std::string, int>(disk_sn, diskInfo.id));
		diskInfo.label_initialized = true;
		diskInfo.sn_initialized = true;
		// unlikely that somebody put the swap on a removable disk.
		// this is a first rough guess on what can be a preferred disk for blkid devices
		// just in case /etc/fstab can't be accessed or it is not up to date.
		diskInfo.preferred = (disk_type == "swap");
		diskInfos_out.push_back(diskInfo);
	}
	return FUNCTION_RETURN::FUNC_RET_OK;
}